

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O0

BVStatic<256UL> * __thiscall
BVStatic<256ul>::GetRange<256ul>(BVStatic<256ul> *this,BVIndex startOffset)

{
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  BVStatic<256UL> *pBVar4;
  undefined8 *in_FS_OFFSET;
  BVIndex startOffset_local;
  BVStatic<256UL> *this_local;
  
  BVStatic<256UL>::AssertRange((BVStatic<256UL> *)this,startOffset);
  BVStatic<256UL>::AssertRange((BVStatic<256UL> *)this,startOffset + 0xff);
  BVar3 = BVUnitT<unsigned_long>::Offset(startOffset);
  if (BVar3 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.h"
                       ,0x224,"(BVUnit::Offset(startOffset) == 0)",
                       "BVUnit::Offset(startOffset) == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  BVar3 = BVUnitT<unsigned_long>::Offset(0x100);
  if (BVar3 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.h"
                       ,0x225,"(BVUnit::Offset(rangeSize) == 0)","BVUnit::Offset(rangeSize) == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  pBVar4 = (BVStatic<256UL> *)BVStatic<256UL>::BitsFromIndex((BVStatic<256UL> *)this,startOffset);
  return pBVar4;
}

Assistant:

BVStatic<rangeSize> * GetRange(BVIndex startOffset) const
    {
        AssertRange(startOffset);
        AssertRange(startOffset + rangeSize - 1);

        // Start offset and size must be word-aligned
        Assert(BVUnit::Offset(startOffset) == 0);
        Assert(BVUnit::Offset(rangeSize) == 0);

        return (BVStatic<rangeSize> *)BitsFromIndex(startOffset);
    }